

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  stbi__zhuffman *z;
  uint uVar1;
  stbi_uc *psVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  ushort uVar7;
  uint uVar8;
  int iVar9;
  byte *pbVar10;
  long lVar11;
  stbi_uc *psVar12;
  uint uVar13;
  int iVar14;
  stbi_uc sVar15;
  ulong uVar16;
  long lVar17;
  stbi__uint32 sVar18;
  stbi__uint32 sVar19;
  uint uVar20;
  char *pcVar21;
  int iVar22;
  ulong uVar23;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  undefined8 local_a08;
  undefined7 uStack_a00;
  undefined4 uStack_9f9;
  byte bStack_9e9;
  stbi_uc local_9e8 [468];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_001115b6:
    a->num_bits = 0;
    a->code_buffer = 0;
    z = &a->z_distance;
    iVar9 = 0;
    do {
      if (iVar9 < 1) {
        stbi__fill_bits(a);
        iVar9 = a->num_bits;
      }
      uVar1 = a->code_buffer;
      sVar18 = uVar1 >> 1;
      a->code_buffer = sVar18;
      iVar5 = iVar9 + -1;
      a->num_bits = iVar5;
      if (iVar9 < 3) {
        stbi__fill_bits(a);
        iVar5 = a->num_bits;
        sVar18 = a->code_buffer;
      }
      sVar19 = sVar18 >> 2;
      a->code_buffer = sVar19;
      uVar4 = iVar5 - 2;
      a->num_bits = uVar4;
      switch(sVar18 & 3) {
      case 0:
        uVar13 = uVar4 & 7;
        if (uVar13 != 0) {
          if (iVar5 < 2) {
            stbi__fill_bits(a);
            uVar4 = a->num_bits;
            sVar19 = a->code_buffer;
          }
          sVar19 = sVar19 >> (sbyte)uVar13;
          a->code_buffer = sVar19;
          uVar4 = uVar4 - uVar13;
          a->num_bits = uVar4;
        }
        if ((int)uVar4 < 1) {
          if (uVar4 != 0) goto LAB_00111f4c;
          uVar23 = 0;
LAB_00111e18:
          psVar12 = a->zbuffer;
          psVar2 = a->zbuffer_end;
          do {
            if (psVar12 < psVar2) {
              a->zbuffer = psVar12 + 1;
              sVar15 = *psVar12;
              psVar12 = psVar12 + 1;
            }
            else {
              sVar15 = '\0';
            }
            *(stbi_uc *)((long)local_814.fast + uVar23) = sVar15;
            uVar23 = uVar23 + 1;
          } while (uVar23 != 4);
        }
        else {
          uVar13 = uVar4 - 1 >> 3;
          uVar23 = (ulong)(uVar13 + 1);
          uVar16 = 0xffffffffffffffff;
          do {
            *(char *)((long)local_814.fast + uVar16 + 1) = (char)sVar19;
            sVar19 = sVar19 >> 8;
            uVar16 = uVar16 + 1;
          } while (uVar13 != uVar16);
          a->code_buffer = sVar19;
          iVar9 = (uVar4 - 8) - (uVar4 - 1 & 0xfffffff8);
          a->num_bits = iVar9;
          if (iVar9 != 0) {
LAB_00111f4c:
            __assert_fail("a->num_bits == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/stb_image.h"
                          ,0xebc,"int stbi__parse_uncompressed_block(stbi__zbuf *)");
          }
          if (uVar16 < 3) goto LAB_00111e18;
        }
        if ((local_814.fast[1] ^ local_814.fast[0]) != 0xffff) {
          stbi__g_failure_reason = "zlib corrupt";
          return 0;
        }
        psVar12 = a->zbuffer;
        uVar23 = (ulong)local_814.fast[0];
        if (a->zbuffer_end < psVar12 + uVar23) {
          stbi__g_failure_reason = "read past buffer";
          return 0;
        }
        pcVar21 = a->zout;
        if (a->zout_end < pcVar21 + uVar23) {
          iVar9 = stbi__zexpand(a,pcVar21,(uint)local_814.fast[0]);
          if (iVar9 == 0) {
            return 0;
          }
          psVar12 = a->zbuffer;
          pcVar21 = a->zout;
        }
        memcpy(pcVar21,psVar12,uVar23);
        a->zbuffer = a->zbuffer + uVar23;
        a->zout = a->zout + uVar23;
        goto LAB_00111eba;
      case 1:
        if (stbi__zdefault_distance[0x1f] == '\0') {
          memset(stbi__zdefault_length,8,0x90);
          builtin_memcpy(stbi__zdefault_length + 0x90,
                         "\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                         ,0x90);
          builtin_memcpy(stbi__zdefault_distance,
                         "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
                         ,0x20);
        }
        iVar9 = stbi__zbuild_huffman(&a->z_length,stbi__zdefault_length,0x120);
        if (iVar9 == 0) {
          return 0;
        }
        iVar9 = stbi__zbuild_huffman(z,stbi__zdefault_distance,0x20);
        break;
      case 2:
        if (iVar5 < 7) {
          stbi__fill_bits(a);
          uVar4 = a->num_bits;
          sVar19 = a->code_buffer;
        }
        uVar13 = sVar19 >> 5;
        a->code_buffer = uVar13;
        iVar9 = uVar4 - 5;
        a->num_bits = iVar9;
        if ((int)uVar4 < 10) {
          stbi__fill_bits(a);
          iVar9 = a->num_bits;
          uVar13 = a->code_buffer;
        }
        uVar4 = uVar13 >> 5;
        a->code_buffer = uVar4;
        iVar5 = iVar9 + -5;
        a->num_bits = iVar5;
        if (iVar9 < 9) {
          stbi__fill_bits(a);
          iVar5 = a->num_bits;
          uVar4 = a->code_buffer;
        }
        uVar20 = (sVar19 & 0x1f) + 0x101;
        iVar9 = (uVar13 & 0x1f) + 1;
        uVar13 = uVar4 >> 4;
        a->code_buffer = uVar13;
        iVar5 = iVar5 + -4;
        a->num_bits = iVar5;
        local_a08 = 0;
        uStack_a00 = 0;
        uStack_9f9 = 0;
        uVar23 = 0;
        do {
          uVar8 = uVar13;
          if (iVar5 < 3) {
            stbi__fill_bits(a);
            iVar5 = a->num_bits;
            uVar8 = a->code_buffer;
          }
          uVar13 = uVar8 >> 3;
          a->code_buffer = uVar13;
          iVar5 = iVar5 + -3;
          a->num_bits = iVar5;
          *(byte *)((long)&local_a08 +
                   (ulong)(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[uVar23]
                   ) = (byte)uVar8 & 7;
          uVar23 = uVar23 + 1;
        } while ((uVar4 & 0xf) + 4 != uVar23);
        iVar5 = stbi__zbuild_huffman(&local_814,(stbi_uc *)&local_a08,0x13);
        if (iVar5 == 0) {
          return 0;
        }
        iVar22 = iVar9 + uVar20;
        iVar5 = a->num_bits;
        iVar14 = 0;
        do {
          if (iVar5 < 0x10) {
            stbi__fill_bits(a);
          }
          uVar4 = a->code_buffer;
          uVar7 = local_814.fast[uVar4 & 0x1ff];
          if (uVar7 == 0) {
            uVar7 = (ushort)uVar4 << 8 | (ushort)uVar4 >> 8;
            uVar13 = (uVar7 & 0xf0f) << 4 | (uVar7 & 0xf0f0) >> 4;
            uVar13 = (uVar13 >> 2 & 0x3333) + (uVar13 & 0x3333) * 4;
            uVar13 = (uVar13 >> 1 & 0x5555) + (uVar13 & 0x5555) * 2;
            lVar6 = 0;
            do {
              lVar11 = lVar6;
              lVar6 = lVar11 + 1;
            } while (local_814.maxcode[lVar11 + 10] <= (int)uVar13);
            if (lVar6 == 7) goto LAB_00111ed0;
            lVar17 = (ulong)local_814.firstsymbol[lVar11 + 10] +
                     ((ulong)(uVar13 >> (7U - (char)lVar6 & 0x1f)) -
                     (ulong)local_814.firstcode[lVar11 + 10]);
            if ((ulong)*(byte *)((long)&local_814 + lVar17 + 0x484) - 9 != lVar6) goto LAB_00111f2d;
            uVar4 = uVar4 >> ((char)lVar11 + 10U & 0x1f);
            a->code_buffer = uVar4;
            iVar5 = (a->num_bits - (int)lVar6) + -9;
            a->num_bits = iVar5;
            uVar7 = *(ushort *)((long)&local_814 + lVar17 * 2 + 0x5a4);
          }
          else {
            uVar4 = uVar4 >> ((byte)(uVar7 >> 9) & 0x1f);
            a->code_buffer = uVar4;
            iVar5 = a->num_bits - (uint)(uVar7 >> 9);
            a->num_bits = iVar5;
            uVar7 = uVar7 & 0x1ff;
          }
          if (0x12 < uVar7) goto LAB_00111ed0;
          if (uVar7 < 0x10) {
            lVar6 = (long)iVar14;
            iVar14 = iVar14 + 1;
            local_9e8[lVar6] = (char)uVar7;
          }
          else {
            if (uVar7 == 0x11) {
              if (iVar5 < 3) {
                stbi__fill_bits(a);
                iVar5 = a->num_bits;
                uVar4 = a->code_buffer;
              }
              uVar13 = uVar4 & 7;
              a->code_buffer = uVar4 >> 3;
              iVar5 = iVar5 + -3;
              a->num_bits = iVar5;
              uVar4 = 0;
            }
            else {
              if (uVar7 != 0x10) {
                if (iVar5 < 7) {
                  stbi__fill_bits(a);
                  iVar5 = a->num_bits;
                  uVar4 = a->code_buffer;
                }
                a->code_buffer = uVar4 >> 7;
                iVar5 = iVar5 + -7;
                a->num_bits = iVar5;
                memset(local_9e8 + iVar14,0,(ulong)((uVar4 & 0x7f) + 0xb));
                iVar14 = iVar14 + (uVar4 & 0x7f) + 0xb;
                goto LAB_00111a82;
              }
              if (iVar5 < 2) {
                stbi__fill_bits(a);
                iVar5 = a->num_bits;
                uVar4 = a->code_buffer;
              }
              uVar13 = uVar4 & 3;
              a->code_buffer = uVar4 >> 2;
              iVar5 = iVar5 + -2;
              a->num_bits = iVar5;
              uVar4 = (uint)(&bStack_9e9)[iVar14];
            }
            memset(local_9e8 + iVar14,uVar4,(ulong)(uVar13 + 3));
            iVar14 = iVar14 + uVar13 + 3;
          }
LAB_00111a82:
        } while (iVar14 < iVar22);
        if (iVar14 != iVar22) {
LAB_00111ed0:
          stbi__g_failure_reason = "bad codelengths";
          return 0;
        }
        iVar5 = stbi__zbuild_huffman(&a->z_length,local_9e8,uVar20);
        if (iVar5 == 0) {
          return 0;
        }
        iVar9 = stbi__zbuild_huffman(z,local_9e8 + uVar20,iVar9);
        break;
      case 3:
        goto switchD_0011163e_caseD_3;
      }
      if (iVar9 == 0) {
        stbi__zdefault_distance[0] = (stbi_uc)stbi__zdefault_distance._0_8_;
        stbi__zdefault_distance[1] = SUB81(stbi__zdefault_distance._0_8_,1);
        stbi__zdefault_distance[2] = SUB81(stbi__zdefault_distance._0_8_,2);
        stbi__zdefault_distance[3] = SUB81(stbi__zdefault_distance._0_8_,3);
        stbi__zdefault_distance[4] = SUB81(stbi__zdefault_distance._0_8_,4);
        stbi__zdefault_distance[5] = SUB81(stbi__zdefault_distance._0_8_,5);
        stbi__zdefault_distance[6] = SUB81(stbi__zdefault_distance._0_8_,6);
        stbi__zdefault_distance[7] = SUB81(stbi__zdefault_distance._0_8_,7);
        stbi__zdefault_distance[8] = (stbi_uc)stbi__zdefault_distance._8_8_;
        stbi__zdefault_distance[9] = SUB81(stbi__zdefault_distance._8_8_,1);
        stbi__zdefault_distance[10] = SUB81(stbi__zdefault_distance._8_8_,2);
        stbi__zdefault_distance[0xb] = SUB81(stbi__zdefault_distance._8_8_,3);
        stbi__zdefault_distance[0xc] = SUB81(stbi__zdefault_distance._8_8_,4);
        stbi__zdefault_distance[0xd] = SUB81(stbi__zdefault_distance._8_8_,5);
        stbi__zdefault_distance[0xe] = SUB81(stbi__zdefault_distance._8_8_,6);
        stbi__zdefault_distance[0xf] = SUB81(stbi__zdefault_distance._8_8_,7);
        stbi__zdefault_distance[0x10] = (stbi_uc)stbi__zdefault_distance._16_8_;
        stbi__zdefault_distance[0x11] = SUB81(stbi__zdefault_distance._16_8_,1);
        stbi__zdefault_distance[0x12] = SUB81(stbi__zdefault_distance._16_8_,2);
        stbi__zdefault_distance[0x13] = SUB81(stbi__zdefault_distance._16_8_,3);
        stbi__zdefault_distance[0x14] = SUB81(stbi__zdefault_distance._16_8_,4);
        stbi__zdefault_distance[0x15] = SUB81(stbi__zdefault_distance._16_8_,5);
        stbi__zdefault_distance[0x16] = SUB81(stbi__zdefault_distance._16_8_,6);
        stbi__zdefault_distance[0x17] = SUB81(stbi__zdefault_distance._16_8_,7);
        stbi__zdefault_distance[0x18] = (stbi_uc)stbi__zdefault_distance._24_8_;
        stbi__zdefault_distance[0x19] = SUB81(stbi__zdefault_distance._24_8_,1);
        stbi__zdefault_distance[0x1a] = SUB81(stbi__zdefault_distance._24_8_,2);
        stbi__zdefault_distance[0x1b] = SUB81(stbi__zdefault_distance._24_8_,3);
        stbi__zdefault_distance[0x1c] = SUB81(stbi__zdefault_distance._24_8_,4);
        stbi__zdefault_distance[0x1d] = SUB81(stbi__zdefault_distance._24_8_,5);
        stbi__zdefault_distance[0x1e] = SUB81(stbi__zdefault_distance._24_8_,6);
        stbi__zdefault_distance[0x1f] = SUB81(stbi__zdefault_distance._24_8_,7);
        stbi__zdefault_length[0x90] = (stbi_uc)stbi__zdefault_length._144_8_;
        stbi__zdefault_length[0x91] = SUB81(stbi__zdefault_length._144_8_,1);
        stbi__zdefault_length[0x92] = SUB81(stbi__zdefault_length._144_8_,2);
        stbi__zdefault_length[0x93] = SUB81(stbi__zdefault_length._144_8_,3);
        stbi__zdefault_length[0x94] = SUB81(stbi__zdefault_length._144_8_,4);
        stbi__zdefault_length[0x95] = SUB81(stbi__zdefault_length._144_8_,5);
        stbi__zdefault_length[0x96] = SUB81(stbi__zdefault_length._144_8_,6);
        stbi__zdefault_length[0x97] = SUB81(stbi__zdefault_length._144_8_,7);
        stbi__zdefault_length[0x98] = (stbi_uc)stbi__zdefault_length._152_8_;
        stbi__zdefault_length[0x99] = SUB81(stbi__zdefault_length._152_8_,1);
        stbi__zdefault_length[0x9a] = SUB81(stbi__zdefault_length._152_8_,2);
        stbi__zdefault_length[0x9b] = SUB81(stbi__zdefault_length._152_8_,3);
        stbi__zdefault_length[0x9c] = SUB81(stbi__zdefault_length._152_8_,4);
        stbi__zdefault_length[0x9d] = SUB81(stbi__zdefault_length._152_8_,5);
        stbi__zdefault_length[0x9e] = SUB81(stbi__zdefault_length._152_8_,6);
        stbi__zdefault_length[0x9f] = SUB81(stbi__zdefault_length._152_8_,7);
        stbi__zdefault_length[0xa0] = (stbi_uc)stbi__zdefault_length._160_8_;
        stbi__zdefault_length[0xa1] = SUB81(stbi__zdefault_length._160_8_,1);
        stbi__zdefault_length[0xa2] = SUB81(stbi__zdefault_length._160_8_,2);
        stbi__zdefault_length[0xa3] = SUB81(stbi__zdefault_length._160_8_,3);
        stbi__zdefault_length[0xa4] = SUB81(stbi__zdefault_length._160_8_,4);
        stbi__zdefault_length[0xa5] = SUB81(stbi__zdefault_length._160_8_,5);
        stbi__zdefault_length[0xa6] = SUB81(stbi__zdefault_length._160_8_,6);
        stbi__zdefault_length[0xa7] = SUB81(stbi__zdefault_length._160_8_,7);
        stbi__zdefault_length[0xa8] = (stbi_uc)stbi__zdefault_length._168_8_;
        stbi__zdefault_length[0xa9] = SUB81(stbi__zdefault_length._168_8_,1);
        stbi__zdefault_length[0xaa] = SUB81(stbi__zdefault_length._168_8_,2);
        stbi__zdefault_length[0xab] = SUB81(stbi__zdefault_length._168_8_,3);
        stbi__zdefault_length[0xac] = SUB81(stbi__zdefault_length._168_8_,4);
        stbi__zdefault_length[0xad] = SUB81(stbi__zdefault_length._168_8_,5);
        stbi__zdefault_length[0xae] = SUB81(stbi__zdefault_length._168_8_,6);
        stbi__zdefault_length[0xaf] = SUB81(stbi__zdefault_length._168_8_,7);
        stbi__zdefault_length[0xb0] = (stbi_uc)stbi__zdefault_length._176_8_;
        stbi__zdefault_length[0xb1] = SUB81(stbi__zdefault_length._176_8_,1);
        stbi__zdefault_length[0xb2] = SUB81(stbi__zdefault_length._176_8_,2);
        stbi__zdefault_length[0xb3] = SUB81(stbi__zdefault_length._176_8_,3);
        stbi__zdefault_length[0xb4] = SUB81(stbi__zdefault_length._176_8_,4);
        stbi__zdefault_length[0xb5] = SUB81(stbi__zdefault_length._176_8_,5);
        stbi__zdefault_length[0xb6] = SUB81(stbi__zdefault_length._176_8_,6);
        stbi__zdefault_length[0xb7] = SUB81(stbi__zdefault_length._176_8_,7);
        stbi__zdefault_length[0xb8] = (stbi_uc)stbi__zdefault_length._184_8_;
        stbi__zdefault_length[0xb9] = SUB81(stbi__zdefault_length._184_8_,1);
        stbi__zdefault_length[0xba] = SUB81(stbi__zdefault_length._184_8_,2);
        stbi__zdefault_length[0xbb] = SUB81(stbi__zdefault_length._184_8_,3);
        stbi__zdefault_length[0xbc] = SUB81(stbi__zdefault_length._184_8_,4);
        stbi__zdefault_length[0xbd] = SUB81(stbi__zdefault_length._184_8_,5);
        stbi__zdefault_length[0xbe] = SUB81(stbi__zdefault_length._184_8_,6);
        stbi__zdefault_length[0xbf] = SUB81(stbi__zdefault_length._184_8_,7);
        stbi__zdefault_length[0xc0] = (stbi_uc)stbi__zdefault_length._192_8_;
        stbi__zdefault_length[0xc1] = SUB81(stbi__zdefault_length._192_8_,1);
        stbi__zdefault_length[0xc2] = SUB81(stbi__zdefault_length._192_8_,2);
        stbi__zdefault_length[0xc3] = SUB81(stbi__zdefault_length._192_8_,3);
        stbi__zdefault_length[0xc4] = SUB81(stbi__zdefault_length._192_8_,4);
        stbi__zdefault_length[0xc5] = SUB81(stbi__zdefault_length._192_8_,5);
        stbi__zdefault_length[0xc6] = SUB81(stbi__zdefault_length._192_8_,6);
        stbi__zdefault_length[199] = SUB81(stbi__zdefault_length._192_8_,7);
        stbi__zdefault_length[200] = (stbi_uc)stbi__zdefault_length._200_8_;
        stbi__zdefault_length[0xc9] = SUB81(stbi__zdefault_length._200_8_,1);
        stbi__zdefault_length[0xca] = SUB81(stbi__zdefault_length._200_8_,2);
        stbi__zdefault_length[0xcb] = SUB81(stbi__zdefault_length._200_8_,3);
        stbi__zdefault_length[0xcc] = SUB81(stbi__zdefault_length._200_8_,4);
        stbi__zdefault_length[0xcd] = SUB81(stbi__zdefault_length._200_8_,5);
        stbi__zdefault_length[0xce] = SUB81(stbi__zdefault_length._200_8_,6);
        stbi__zdefault_length[0xcf] = SUB81(stbi__zdefault_length._200_8_,7);
        stbi__zdefault_length[0xd0] = (stbi_uc)stbi__zdefault_length._208_8_;
        stbi__zdefault_length[0xd1] = SUB81(stbi__zdefault_length._208_8_,1);
        stbi__zdefault_length[0xd2] = SUB81(stbi__zdefault_length._208_8_,2);
        stbi__zdefault_length[0xd3] = SUB81(stbi__zdefault_length._208_8_,3);
        stbi__zdefault_length[0xd4] = SUB81(stbi__zdefault_length._208_8_,4);
        stbi__zdefault_length[0xd5] = SUB81(stbi__zdefault_length._208_8_,5);
        stbi__zdefault_length[0xd6] = SUB81(stbi__zdefault_length._208_8_,6);
        stbi__zdefault_length[0xd7] = SUB81(stbi__zdefault_length._208_8_,7);
        stbi__zdefault_length[0xd8] = (stbi_uc)stbi__zdefault_length._216_8_;
        stbi__zdefault_length[0xd9] = SUB81(stbi__zdefault_length._216_8_,1);
        stbi__zdefault_length[0xda] = SUB81(stbi__zdefault_length._216_8_,2);
        stbi__zdefault_length[0xdb] = SUB81(stbi__zdefault_length._216_8_,3);
        stbi__zdefault_length[0xdc] = SUB81(stbi__zdefault_length._216_8_,4);
        stbi__zdefault_length[0xdd] = SUB81(stbi__zdefault_length._216_8_,5);
        stbi__zdefault_length[0xde] = SUB81(stbi__zdefault_length._216_8_,6);
        stbi__zdefault_length[0xdf] = SUB81(stbi__zdefault_length._216_8_,7);
        stbi__zdefault_length[0xe0] = (stbi_uc)stbi__zdefault_length._224_8_;
        stbi__zdefault_length[0xe1] = SUB81(stbi__zdefault_length._224_8_,1);
        stbi__zdefault_length[0xe2] = SUB81(stbi__zdefault_length._224_8_,2);
        stbi__zdefault_length[0xe3] = SUB81(stbi__zdefault_length._224_8_,3);
        stbi__zdefault_length[0xe4] = SUB81(stbi__zdefault_length._224_8_,4);
        stbi__zdefault_length[0xe5] = SUB81(stbi__zdefault_length._224_8_,5);
        stbi__zdefault_length[0xe6] = SUB81(stbi__zdefault_length._224_8_,6);
        stbi__zdefault_length[0xe7] = SUB81(stbi__zdefault_length._224_8_,7);
        stbi__zdefault_length[0xe8] = (stbi_uc)stbi__zdefault_length._232_8_;
        stbi__zdefault_length[0xe9] = SUB81(stbi__zdefault_length._232_8_,1);
        stbi__zdefault_length[0xea] = SUB81(stbi__zdefault_length._232_8_,2);
        stbi__zdefault_length[0xeb] = SUB81(stbi__zdefault_length._232_8_,3);
        stbi__zdefault_length[0xec] = SUB81(stbi__zdefault_length._232_8_,4);
        stbi__zdefault_length[0xed] = SUB81(stbi__zdefault_length._232_8_,5);
        stbi__zdefault_length[0xee] = SUB81(stbi__zdefault_length._232_8_,6);
        stbi__zdefault_length[0xef] = SUB81(stbi__zdefault_length._232_8_,7);
        stbi__zdefault_length[0xf0] = (stbi_uc)stbi__zdefault_length._240_8_;
        stbi__zdefault_length[0xf1] = SUB81(stbi__zdefault_length._240_8_,1);
        stbi__zdefault_length[0xf2] = SUB81(stbi__zdefault_length._240_8_,2);
        stbi__zdefault_length[0xf3] = SUB81(stbi__zdefault_length._240_8_,3);
        stbi__zdefault_length[0xf4] = SUB81(stbi__zdefault_length._240_8_,4);
        stbi__zdefault_length[0xf5] = SUB81(stbi__zdefault_length._240_8_,5);
        stbi__zdefault_length[0xf6] = SUB81(stbi__zdefault_length._240_8_,6);
        stbi__zdefault_length[0xf7] = SUB81(stbi__zdefault_length._240_8_,7);
        stbi__zdefault_length[0xf8] = (stbi_uc)stbi__zdefault_length._248_8_;
        stbi__zdefault_length[0xf9] = SUB81(stbi__zdefault_length._248_8_,1);
        stbi__zdefault_length[0xfa] = SUB81(stbi__zdefault_length._248_8_,2);
        stbi__zdefault_length[0xfb] = SUB81(stbi__zdefault_length._248_8_,3);
        stbi__zdefault_length[0xfc] = SUB81(stbi__zdefault_length._248_8_,4);
        stbi__zdefault_length[0xfd] = SUB81(stbi__zdefault_length._248_8_,5);
        stbi__zdefault_length[0xfe] = SUB81(stbi__zdefault_length._248_8_,6);
        stbi__zdefault_length[0xff] = SUB81(stbi__zdefault_length._248_8_,7);
        stbi__zdefault_length[0x100] = (stbi_uc)stbi__zdefault_length._256_8_;
        stbi__zdefault_length[0x101] = SUB81(stbi__zdefault_length._256_8_,1);
        stbi__zdefault_length[0x102] = SUB81(stbi__zdefault_length._256_8_,2);
        stbi__zdefault_length[0x103] = SUB81(stbi__zdefault_length._256_8_,3);
        stbi__zdefault_length[0x104] = SUB81(stbi__zdefault_length._256_8_,4);
        stbi__zdefault_length[0x105] = SUB81(stbi__zdefault_length._256_8_,5);
        stbi__zdefault_length[0x106] = SUB81(stbi__zdefault_length._256_8_,6);
        stbi__zdefault_length[0x107] = SUB81(stbi__zdefault_length._256_8_,7);
        stbi__zdefault_length[0x108] = (stbi_uc)stbi__zdefault_length._264_8_;
        stbi__zdefault_length[0x109] = SUB81(stbi__zdefault_length._264_8_,1);
        stbi__zdefault_length[0x10a] = SUB81(stbi__zdefault_length._264_8_,2);
        stbi__zdefault_length[0x10b] = SUB81(stbi__zdefault_length._264_8_,3);
        stbi__zdefault_length[0x10c] = SUB81(stbi__zdefault_length._264_8_,4);
        stbi__zdefault_length[0x10d] = SUB81(stbi__zdefault_length._264_8_,5);
        stbi__zdefault_length[0x10e] = SUB81(stbi__zdefault_length._264_8_,6);
        stbi__zdefault_length[0x10f] = SUB81(stbi__zdefault_length._264_8_,7);
        stbi__zdefault_length[0x110] = (stbi_uc)stbi__zdefault_length._272_8_;
        stbi__zdefault_length[0x111] = SUB81(stbi__zdefault_length._272_8_,1);
        stbi__zdefault_length[0x112] = SUB81(stbi__zdefault_length._272_8_,2);
        stbi__zdefault_length[0x113] = SUB81(stbi__zdefault_length._272_8_,3);
        stbi__zdefault_length[0x114] = SUB81(stbi__zdefault_length._272_8_,4);
        stbi__zdefault_length[0x115] = SUB81(stbi__zdefault_length._272_8_,5);
        stbi__zdefault_length[0x116] = SUB81(stbi__zdefault_length._272_8_,6);
        stbi__zdefault_length[0x117] = SUB81(stbi__zdefault_length._272_8_,7);
        stbi__zdefault_length[0x118] = (stbi_uc)stbi__zdefault_length._280_8_;
        stbi__zdefault_length[0x119] = SUB81(stbi__zdefault_length._280_8_,1);
        stbi__zdefault_length[0x11a] = SUB81(stbi__zdefault_length._280_8_,2);
        stbi__zdefault_length[0x11b] = SUB81(stbi__zdefault_length._280_8_,3);
        stbi__zdefault_length[0x11c] = SUB81(stbi__zdefault_length._280_8_,4);
        stbi__zdefault_length[0x11d] = SUB81(stbi__zdefault_length._280_8_,5);
        stbi__zdefault_length[0x11e] = SUB81(stbi__zdefault_length._280_8_,6);
        stbi__zdefault_length[0x11f] = SUB81(stbi__zdefault_length._280_8_,7);
        return 0;
      }
      pcVar21 = a->zout;
      while( true ) {
        while( true ) {
          if (a->num_bits < 0x10) {
            stbi__fill_bits(a);
          }
          uVar4 = a->code_buffer;
          uVar7 = (a->z_length).fast[uVar4 & 0x1ff];
          if (uVar7 == 0) {
            uVar7 = (ushort)uVar4 << 8 | (ushort)uVar4 >> 8;
            uVar13 = (uVar7 & 0xf0f) << 4 | (uVar7 & 0xf0f0) >> 4;
            uVar13 = (uVar13 >> 2 & 0x3333) + (uVar13 & 0x3333) * 4;
            uVar13 = (uVar13 >> 1 & 0x5555) + (uVar13 & 0x5555) * 2;
            lVar6 = 0;
            do {
              lVar11 = lVar6;
              lVar6 = lVar11 + 1;
            } while ((a->z_length).maxcode[lVar11 + 10] <= (int)uVar13);
            if (lVar6 == 7) goto LAB_00111ee2;
            lVar17 = (ulong)(a->z_length).firstsymbol[lVar11 + 10] +
                     ((ulong)(uVar13 >> (7U - (char)lVar6 & 0x1f)) -
                     (ulong)(a->z_length).firstcode[lVar11 + 10]);
            if ((ulong)*(byte *)((long)a + lVar17 + 0x4b8) - 9 != lVar6) goto LAB_00111f2d;
            uVar4 = uVar4 >> ((char)lVar11 + 10U & 0x1f);
            a->code_buffer = uVar4;
            iVar9 = (a->num_bits - (int)lVar6) + -9;
            a->num_bits = iVar9;
            uVar13 = (uint)*(ushort *)((long)a + lVar17 * 2 + 0x5d8);
          }
          else {
            uVar4 = uVar4 >> ((byte)(uVar7 >> 9) & 0x1f);
            a->code_buffer = uVar4;
            iVar9 = a->num_bits - (uint)(uVar7 >> 9);
            a->num_bits = iVar9;
            uVar13 = uVar7 & 0x1ff;
          }
          if (0xff < uVar13) break;
          if (a->zout_end <= pcVar21) {
            iVar9 = stbi__zexpand(a,pcVar21,1);
            if (iVar9 == 0) {
              return 0;
            }
            pcVar21 = a->zout;
          }
          *pcVar21 = (char)uVar13;
          pcVar21 = pcVar21 + 1;
        }
        if (uVar13 == 0x100) break;
        uVar23 = (ulong)(uVar13 - 0x101);
        uVar13 = stbi__zlength_base[uVar23];
        if (0xffffffffffffffeb < uVar23 - 0x1c) {
          iVar5 = stbi__zlength_extra[uVar23];
          if (iVar9 < iVar5) {
            stbi__fill_bits(a);
            iVar9 = a->num_bits;
            uVar4 = a->code_buffer;
          }
          uVar20 = ~(-1 << ((byte)iVar5 & 0x1f)) & uVar4;
          uVar4 = uVar4 >> ((byte)iVar5 & 0x1f);
          a->code_buffer = uVar4;
          iVar9 = iVar9 - iVar5;
          a->num_bits = iVar9;
          uVar13 = uVar13 + uVar20;
        }
        if (iVar9 < 0x10) {
          stbi__fill_bits(a);
          uVar4 = a->code_buffer;
        }
        uVar7 = z->fast[uVar4 & 0x1ff];
        if (uVar7 == 0) {
          uVar7 = (ushort)uVar4 << 8 | (ushort)uVar4 >> 8;
          uVar20 = (uVar7 & 0xf0f) << 4 | (uVar7 & 0xf0f0) >> 4;
          uVar20 = (uVar20 >> 2 & 0x3333) + (uVar20 & 0x3333) * 4;
          uVar20 = (uVar20 >> 1 & 0x5555) + (uVar20 & 0x5555) * 2;
          lVar6 = 0;
          do {
            lVar11 = lVar6;
            lVar6 = lVar11 + 1;
          } while ((a->z_distance).maxcode[lVar11 + 10] <= (int)uVar20);
          if (lVar6 == 7) {
LAB_00111ee2:
            stbi__g_failure_reason = "bad huffman code";
            return 0;
          }
          lVar17 = (ulong)(a->z_distance).firstsymbol[lVar11 + 10] +
                   ((ulong)(uVar20 >> (7U - (char)lVar6 & 0x1f)) -
                   (ulong)(a->z_distance).firstcode[lVar11 + 10]);
          if ((ulong)*(byte *)((long)a + lVar17 + 0xc9c) - 9 != lVar6) {
LAB_00111f2d:
            __assert_fail("z->size[b] == s",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/stb_image.h"
                          ,0xe22,
                          "int stbi__zhuffman_decode_slowpath(stbi__zbuf *, stbi__zhuffman *)");
          }
          uVar4 = uVar4 >> ((char)lVar11 + 10U & 0x1f);
          a->code_buffer = uVar4;
          iVar9 = (a->num_bits - (int)lVar6) + -9;
          a->num_bits = iVar9;
          uVar20 = (uint)*(ushort *)((long)a + lVar17 * 2 + 0xdbc);
        }
        else {
          uVar4 = uVar4 >> ((byte)(uVar7 >> 9) & 0x1f);
          a->code_buffer = uVar4;
          iVar9 = a->num_bits - (uint)(uVar7 >> 9);
          a->num_bits = iVar9;
          uVar20 = uVar7 & 0x1ff;
        }
        uVar23 = (ulong)uVar20;
        iVar5 = stbi__zdist_base[uVar23];
        if (0xffffffffffffffe5 < uVar23 - 0x1e) {
          iVar14 = stbi__zdist_extra[uVar23];
          if (iVar9 < iVar14) {
            stbi__fill_bits(a);
            iVar9 = a->num_bits;
            uVar4 = a->code_buffer;
          }
          a->code_buffer = uVar4 >> ((byte)iVar14 & 0x1f);
          a->num_bits = iVar9 - iVar14;
          iVar5 = iVar5 + (~(-1 << ((byte)iVar14 & 0x1f)) & uVar4);
        }
        if ((long)pcVar21 - (long)a->zout_start < (long)iVar5) {
          stbi__g_failure_reason = "bad dist";
          return 0;
        }
        if (a->zout_end < pcVar21 + (int)uVar13) {
          iVar9 = stbi__zexpand(a,pcVar21,uVar13);
          if (iVar9 == 0) {
            return 0;
          }
          pcVar21 = a->zout;
        }
        lVar6 = -(long)iVar5;
        if (iVar5 == 1) {
          if (uVar13 != 0) {
            memset(pcVar21,(uint)(byte)pcVar21[lVar6],(ulong)uVar13);
            pcVar21 = pcVar21 + (ulong)(uVar13 - 1) + 1;
          }
        }
        else {
          for (; uVar13 != 0; uVar13 = uVar13 - 1) {
            *pcVar21 = pcVar21[lVar6];
            pcVar21 = pcVar21 + 1;
          }
        }
      }
      a->zout = pcVar21;
LAB_00111eba:
      if ((uVar1 & 1) != 0) {
        return 1;
      }
      iVar9 = a->num_bits;
    } while( true );
  }
  pbVar10 = a->zbuffer;
  uVar7 = 0;
  if (pbVar10 < a->zbuffer_end) {
    a->zbuffer = pbVar10 + 1;
    bVar3 = *pbVar10;
    pbVar10 = pbVar10 + 1;
  }
  else {
    bVar3 = 0;
  }
  if (pbVar10 < a->zbuffer_end) {
    a->zbuffer = pbVar10 + 1;
    uVar7 = (ushort)*pbVar10;
  }
  if ((ushort)(((ushort)bVar3 << 8 | uVar7) * 0x7bdf) < 0x843) {
    if ((uVar7 & 0x20) == 0) {
      if ((bVar3 & 0xf) == 8) goto LAB_001115b6;
      stbi__g_failure_reason = "bad compression";
    }
    else {
      stbi__g_failure_reason = "no preset dict";
    }
  }
  else {
    stbi__g_failure_reason = "bad zlib header";
  }
switchD_0011163e_caseD_3:
  return 0;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}